

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_compact(REF_NODE ref_node,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  REF_GLOB *pRVar1;
  bool bVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  
  if ((long)ref_node->max < 0) {
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x366,
           "ref_node_compact","malloc *o2n_ptr of REF_INT negative");
    RVar3 = 1;
  }
  else {
    pRVar4 = (REF_INT *)malloc((long)ref_node->max << 2);
    *o2n_ptr = pRVar4;
    if (pRVar4 == (REF_INT *)0x0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x366,
             "ref_node_compact","malloc *o2n_ptr of REF_INT NULL");
      RVar3 = 2;
    }
    else {
      bVar2 = true;
      if (0 < ref_node->max) {
        uVar7 = 1;
        if (1 < ref_node->max) {
          uVar7 = (ulong)(uint)ref_node->max;
        }
        pRVar4 = (REF_INT *)memset(pRVar4,0xff,uVar7 << 2);
      }
      RVar3 = (REF_STATUS)pRVar4;
    }
  }
  if (!bVar2) {
    return RVar3;
  }
  if ((long)ref_node->n < 0) {
    pcVar11 = "malloc *n2o_ptr of REF_INT negative";
    uVar8 = 0x368;
  }
  else {
    pRVar4 = *o2n_ptr;
    pRVar5 = (REF_INT *)malloc((long)ref_node->n << 2);
    *n2o_ptr = pRVar5;
    if (pRVar5 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x368,
             "ref_node_compact","malloc *n2o_ptr of REF_INT NULL");
      return 2;
    }
    if (ref_node->max < 1) {
      iVar6 = 0;
    }
    else {
      pRVar1 = ref_node->global;
      lVar9 = 0;
      iVar6 = 0;
      do {
        if ((-1 < pRVar1[lVar9]) && (ref_node->ref_mpi->id == ref_node->part[lVar9])) {
          pRVar4[lVar9] = iVar6;
          iVar6 = iVar6 + 1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_node->max);
    }
    uVar10 = ref_node->max;
    if (0 < (int)uVar10) {
      pRVar1 = ref_node->global;
      lVar9 = 0;
      do {
        if ((-1 < pRVar1[lVar9]) && (ref_node->ref_mpi->id != ref_node->part[lVar9])) {
          pRVar4[lVar9] = iVar6;
          iVar6 = iVar6 + 1;
        }
        lVar9 = lVar9 + 1;
        uVar10 = ref_node->max;
      } while (lVar9 < (int)uVar10);
    }
    if (iVar6 == ref_node->n) {
      if (0 < (int)uVar10) {
        pRVar1 = ref_node->global;
        uVar7 = 0;
        do {
          if (-1 < pRVar1[uVar7]) {
            pRVar5[pRVar4[uVar7]] = (REF_INT)uVar7;
          }
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      return 0;
    }
    pcVar11 = "nnode miscount";
    uVar8 = 0x37b;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
         "ref_node_compact",pcVar11);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_node_compact(REF_NODE ref_node, REF_INT **o2n_ptr,
                                    REF_INT **n2o_ptr) {
  REF_INT node;
  REF_INT nnode;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_node_n(ref_node), REF_INT);
  n2o = *n2o_ptr;

  nnode = 0;

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_node_mpi(ref_node)) == ref_node_part(ref_node, node)) {
      o2n[node] = nnode;
      nnode++;
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_node_mpi(ref_node)) != ref_node_part(ref_node, node)) {
      o2n[node] = nnode;
      nnode++;
    }
  }

  RES(nnode, ref_node_n(ref_node), "nnode miscount");

  each_ref_node_valid_node(ref_node, node) n2o[o2n[node]] = node;

  return REF_SUCCESS;
}